

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O2

void __thiscall Expr::~Expr(Expr *this)

{
  ID *this_00;
  _Vector_base<Expr_*,_std::allocator<Expr_*>_> *this_01;
  _Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_> *this_02;
  pointer ppEVar1;
  pointer ppCVar2;
  
  (this->super_DataDepElement)._vptr_DataDepElement = (_func_int **)&PTR__Expr_00140bb0;
  this_00 = this->id_;
  if (this_00 != (ID *)0x0) {
    ID::~ID(this_00);
  }
  operator_delete(this_00,0x78);
  if (this->operand_[0] != (Expr *)0x0) {
    (*(this->operand_[0]->super_DataDepElement)._vptr_DataDepElement[1])();
  }
  if (this->operand_[1] != (Expr *)0x0) {
    (*(this->operand_[1]->super_DataDepElement)._vptr_DataDepElement[1])();
  }
  if (this->operand_[2] != (Expr *)0x0) {
    (*(this->operand_[2]->super_DataDepElement)._vptr_DataDepElement[1])();
  }
  this_01 = &this->args_->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>;
  if (this_01 == (_Vector_base<Expr_*,_std::allocator<Expr_*>_> *)0x0) {
    this_01 = (_Vector_base<Expr_*,_std::allocator<Expr_*>_> *)0x0;
  }
  else {
    for (ppEVar1 = (((_Vector_base<Expr_*,_std::allocator<Expr_*>_> *)&this_01->_M_impl)->_M_impl).
                   super__Vector_impl_data._M_start;
        ppEVar1 != (this_01->_M_impl).super__Vector_impl_data._M_finish; ppEVar1 = ppEVar1 + 1) {
      if (*ppEVar1 != (Expr *)0x0) {
        (*((*ppEVar1)->super_DataDepElement)._vptr_DataDepElement[1])();
        this_01 = &this->args_->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>;
      }
    }
    std::_Vector_base<Expr_*,_std::allocator<Expr_*>_>::~_Vector_base(this_01);
  }
  operator_delete(this_01,0x18);
  this->args_ = (ExprList *)0x0;
  this_02 = &this->cases_->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>;
  if (this_02 == (_Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_> *)0x0) {
    this_02 = (_Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_> *)0x0;
  }
  else {
    for (ppCVar2 = (((_Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_> *)&this_02->_M_impl)->
                   _M_impl).super__Vector_impl_data._M_start;
        ppCVar2 != (this_02->_M_impl).super__Vector_impl_data._M_finish; ppCVar2 = ppCVar2 + 1) {
      if (*ppCVar2 != (CaseExpr *)0x0) {
        (*((*ppCVar2)->super_DataDepElement)._vptr_DataDepElement[1])();
        this_02 = &this->cases_->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>;
      }
    }
    std::_Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>::~_Vector_base(this_02);
  }
  operator_delete(this_02,0x18);
  this->cases_ = (CaseExprList *)0x0;
  std::__cxx11::string::~string((string *)&this->orig_);
  std::__cxx11::string::~string((string *)&this->str_);
  Object::~Object(&this->super_Object);
  return;
}

Assistant:

Expr::~Expr()
	{
	delete id_;
	delete operand_[0];
	delete operand_[1];
	delete operand_[2];
	delete_list(ExprList, args_);
	delete_list(CaseExprList, cases_);
	}